

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall
AssignmentStatement::AssignmentStatement(AssignmentStatement *this,string *lhsVar,ExprNode *rhsExpr)

{
  Function::Function(&this->super_Function);
  (this->super_Functions)._functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Functions)._functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Functions)._functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Function).super_Statement._vptr_Statement = (_func_int **)&PTR_print_00117b80;
  std::__cxx11::string::string((string *)&this->_lhsVariable,(string *)lhsVar);
  this->_rhsExpression = rhsExpr;
  this->_testlist = (Testlist *)0x0;
  this->_subscription = (ExprNode *)0x0;
  (this->_functionStack).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_functionStack).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_functionStack).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

AssignmentStatement::AssignmentStatement(std::string lhsVar, ExprNode *rhsExpr):
        _lhsVariable{lhsVar}, _rhsExpression{rhsExpr},_testlist{nullptr},_subscription{nullptr} {}